

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::Own<const_kj::ReadableDirectory>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenSubdir(DiskHandle *this,PathPtr path)

{
  Disposer *extraout_RAX;
  size_t in_RCX;
  ReadableDirectory *extraout_RDX;
  PathPtr path_00;
  Own<kj::ReadableDirectory> OVar1;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> MVar2;
  Maybe<kj::AutoCloseFd> local_34;
  AutoCloseFd local_28;
  AutoCloseFd AStack_20;
  
  path_00.parts.ptr = (String *)path.parts.size_;
  path_00.parts.size_ = in_RCX;
  tryOpenSubdirInternal(&local_34,(DiskHandle *)path.parts.ptr,path_00);
  OVar1 = (Own<kj::ReadableDirectory>)
          Maybe<kj::AutoCloseFd>::map<kj::Own<kj::ReadableDirectory>_(&)(kj::AutoCloseFd)>
                    ((Maybe<kj::AutoCloseFd> *)&local_28,
                     (_func_Own<kj::ReadableDirectory>_AutoCloseFd *)&local_34);
  this->fd = local_28;
  this[1].fd = AStack_20;
  AStack_20.fd = 0;
  AStack_20.unwindDetector.uncaughtCount = 0;
  if (local_34.ptr.isSet == true) {
    AutoCloseFd::~AutoCloseFd(&local_34.ptr.field_1.value);
    OVar1.ptr = extraout_RDX;
    OVar1.disposer = extraout_RAX;
  }
  MVar2.ptr.disposer = OVar1.disposer;
  MVar2.ptr.ptr = OVar1.ptr;
  return (Maybe<kj::Own<const_kj::ReadableDirectory>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const {
    return tryOpenSubdirInternal(path).map(newDiskReadableDirectory);
  }